

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Ppmd7.c
# Opt level: O0

void UpdateModel(CPpmd7 *p)

{
  Byte BVar1;
  byte bVar2;
  ushort uVar3;
  ushort uVar4;
  Byte *pBVar5;
  short sVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  short *psVar11;
  CTX_PTR pCVar12;
  undefined4 *puVar13;
  CPpmd_State *pCVar14;
  CPpmd7 *in_RDI;
  CPpmd_State *s_4;
  CPpmd_State *s_3;
  UInt32 n;
  UInt32 *s_2;
  UInt32 *d;
  void *oldPtr;
  void *ptr;
  uint i;
  uint oldNU;
  UInt32 sf;
  UInt32 cf;
  uint ns1;
  CTX_PTR cs;
  CPpmd_State *s_1;
  CPpmd_State *s;
  uint ns;
  uint s0;
  CTX_PTR c;
  CPpmd_Void_Ref fSuccessor;
  CPpmd_Void_Ref successor;
  Bool_conflict in_stack_000001c4;
  CPpmd7 *in_stack_000001c8;
  undefined4 *in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff88;
  uint in_stack_ffffffffffffff8c;
  Byte *local_70;
  undefined4 *local_68;
  undefined4 in_stack_ffffffffffffffb0;
  uint in_stack_ffffffffffffffb4;
  CPpmd_State *local_30;
  CPpmd7_Context *local_18;
  uint local_10;
  uint local_c;
  
  local_10 = CONCAT22(in_RDI->FoundState->SuccessorHigh,in_RDI->FoundState->SuccessorLow);
  if ((in_RDI->FoundState->Freq < 0x1f) && (in_RDI->MinContext->Suffix != 0)) {
    psVar11 = (short *)(in_RDI->Base + in_RDI->MinContext->Suffix);
    if (*psVar11 == 1) {
      if (*(byte *)((long)psVar11 + 3) < 0x20) {
        *(char *)((long)psVar11 + 3) = *(char *)((long)psVar11 + 3) + '\x01';
      }
    }
    else {
      pCVar14 = (CPpmd_State *)(in_RDI->Base + *(uint *)(psVar11 + 2));
      if (pCVar14->Symbol != in_RDI->FoundState->Symbol) {
        do {
          local_30 = pCVar14;
          pCVar14 = local_30 + 1;
        } while (pCVar14->Symbol != in_RDI->FoundState->Symbol);
        if (local_30->Freq <= local_30[1].Freq) {
          SwapStates(pCVar14,local_30);
          pCVar14 = local_30;
        }
      }
      local_30 = pCVar14;
      if (local_30->Freq < 0x73) {
        local_30->Freq = local_30->Freq + '\x02';
        psVar11[1] = psVar11[1] + 2;
      }
    }
  }
  if (in_RDI->OrderFall == 0) {
    pCVar12 = CreateSuccessors(in_stack_000001c8,in_stack_000001c4);
    in_RDI->MaxContext = pCVar12;
    in_RDI->MinContext = pCVar12;
    if (in_RDI->MinContext == (CPpmd7_Context *)0x0) {
      RestartModel((CPpmd7 *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
    }
    else {
      SetSuccessor(in_RDI->FoundState,(int)in_RDI->MinContext - (int)in_RDI->Base);
    }
  }
  else {
    BVar1 = in_RDI->FoundState->Symbol;
    pBVar5 = in_RDI->Text;
    in_RDI->Text = pBVar5 + 1;
    *pBVar5 = BVar1;
    local_c = (int)in_RDI->Text - (int)in_RDI->Base;
    if (in_RDI->Text < in_RDI->UnitsStart) {
      if (local_10 == 0) {
        SetSuccessor(in_RDI->FoundState,local_c);
        local_10 = (int)in_RDI->MinContext - (int)in_RDI->Base;
      }
      else {
        if (local_10 <= local_c) {
          pCVar12 = CreateSuccessors(in_stack_000001c8,in_stack_000001c4);
          if (pCVar12 == (CTX_PTR)0x0) {
            RestartModel((CPpmd7 *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
            return;
          }
          local_10 = (int)pCVar12 - (int)in_RDI->Base;
        }
        uVar7 = in_RDI->OrderFall - 1;
        in_RDI->OrderFall = uVar7;
        if (uVar7 == 0) {
          local_c = local_10;
          in_RDI->Text = in_RDI->Text + -(long)(int)(uint)(in_RDI->MaxContext != in_RDI->MinContext)
          ;
        }
      }
      uVar3 = in_RDI->MinContext->SummFreq;
      uVar7 = (uint)in_RDI->MinContext->NumStats;
      bVar2 = in_RDI->FoundState->Freq;
      for (local_18 = in_RDI->MaxContext; local_18 != in_RDI->MinContext;
          local_18 = (CPpmd7_Context *)(in_RDI->Base + local_18->Suffix)) {
        uVar4 = local_18->NumStats;
        uVar8 = (uint)uVar4;
        uVar10 = (uint)((ulong)in_stack_ffffffffffffff80 >> 0x20);
        if (uVar8 == 1) {
          in_stack_ffffffffffffff80 =
               (undefined4 *)
               AllocUnits((CPpmd7 *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),
                          uVar10);
          if (in_stack_ffffffffffffff80 == (undefined4 *)0x0) {
            RestartModel((CPpmd7 *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
            return;
          }
          *in_stack_ffffffffffffff80 = *(undefined4 *)&local_18->SummFreq;
          *(undefined2 *)(in_stack_ffffffffffffff80 + 1) =
               *(undefined2 *)((long)&local_18->Stats + 2);
          local_18->Stats = (int)in_stack_ffffffffffffff80 - (int)in_RDI->Base;
          if (*(byte *)((long)in_stack_ffffffffffffff80 + 1) < 0x1e) {
            *(char *)((long)in_stack_ffffffffffffff80 + 1) =
                 *(char *)((long)in_stack_ffffffffffffff80 + 1) << 1;
          }
          else {
            *(undefined1 *)((long)in_stack_ffffffffffffff80 + 1) = 0x78;
          }
          local_18->SummFreq =
               (ushort)*(byte *)((long)in_stack_ffffffffffffff80 + 1) + (short)in_RDI->InitEsc +
               (ushort)(3 < uVar7);
        }
        else {
          if ((uVar4 & 1) == 0) {
            uVar9 = (uint)(uVar4 >> 1);
            in_stack_ffffffffffffffb4 = (uint)in_RDI->Units2Indx[uVar9 - 1];
            if (in_stack_ffffffffffffffb4 != in_RDI->Units2Indx[uVar9]) {
              puVar13 = (undefined4 *)
                        AllocUnits((CPpmd7 *)
                                   CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),
                                   uVar10);
              if (puVar13 == (undefined4 *)0x0) {
                RestartModel((CPpmd7 *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0)
                            );
                return;
              }
              pBVar5 = in_RDI->Base;
              uVar10 = local_18->Stats;
              local_70 = pBVar5 + uVar10;
              local_68 = puVar13;
              do {
                *local_68 = *(undefined4 *)local_70;
                local_68[1] = *(undefined4 *)(local_70 + 4);
                local_68[2] = *(undefined4 *)(local_70 + 8);
                local_70 = local_70 + 0xc;
                local_68 = local_68 + 3;
                uVar9 = uVar9 - 1;
              } while (uVar9 != 0);
              InsertNode(in_RDI,pBVar5 + uVar10,in_stack_ffffffffffffffb4);
              local_18->Stats = (int)puVar13 - (int)in_RDI->Base;
              in_stack_ffffffffffffff8c = uVar9;
            }
          }
          local_18->SummFreq =
               local_18->SummFreq + (ushort)(uVar8 << 1 < uVar7) +
               (ushort)(uVar8 << 2 <= uVar7 && (uint)local_18->SummFreq <= uVar8 << 3) * 2;
        }
        uVar10 = (uint)in_RDI->FoundState->Freq * 2 * (local_18->SummFreq + 6);
        uVar9 = ((uVar3 - uVar7) - (bVar2 - 1)) + (uint)local_18->SummFreq;
        if (uVar10 < uVar9 * 6) {
          sVar6 = (uVar9 < uVar10) + 1 + (ushort)(uVar9 * 4 <= uVar10);
          local_18->SummFreq = local_18->SummFreq + 3;
        }
        else {
          sVar6 = (uVar9 * 9 <= uVar10) + 4 + (ushort)(uVar9 * 0xc <= uVar10) +
                  (ushort)(uVar9 * 0xf <= uVar10);
          local_18->SummFreq = local_18->SummFreq + sVar6;
        }
        pCVar14 = (CPpmd_State *)(in_RDI->Base + (ulong)uVar8 * 6 + (ulong)local_18->Stats);
        SetSuccessor(pCVar14,local_c);
        pCVar14->Symbol = in_RDI->FoundState->Symbol;
        pCVar14->Freq = (Byte)sVar6;
        local_18->NumStats = uVar4 + 1;
      }
      in_RDI->MinContext = (CPpmd7_Context *)(in_RDI->Base + local_10);
      in_RDI->MaxContext = (CPpmd7_Context *)(in_RDI->Base + local_10);
    }
    else {
      RestartModel((CPpmd7 *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
    }
  }
  return;
}

Assistant:

static void UpdateModel(CPpmd7 *p)
{
  CPpmd_Void_Ref successor, fSuccessor = SUCCESSOR(p->FoundState);
  CTX_PTR c;
  unsigned s0, ns;
  
  if (p->FoundState->Freq < MAX_FREQ / 4 && p->MinContext->Suffix != 0)
  {
    c = SUFFIX(p->MinContext);
    
    if (c->NumStats == 1)
    {
      CPpmd_State *s = ONE_STATE(c);
      if (s->Freq < 32)
        s->Freq++;
    }
    else
    {
      CPpmd_State *s = STATS(c);
      if (s->Symbol != p->FoundState->Symbol)
      {
        do { s++; } while (s->Symbol != p->FoundState->Symbol);
        if (s[0].Freq >= s[-1].Freq)
        {
          SwapStates(&s[0], &s[-1]);
          s--;
        }
      }
      if (s->Freq < MAX_FREQ - 9)
      {
        s->Freq += 2;
        c->SummFreq += 2;
      }
    }
  }

  if (p->OrderFall == 0)
  {
    p->MinContext = p->MaxContext = CreateSuccessors(p, True);
    if (p->MinContext == 0)
    {
      RestartModel(p);
      return;
    }
    SetSuccessor(p->FoundState, REF(p->MinContext));
    return;
  }
  
  *p->Text++ = p->FoundState->Symbol;
  successor = REF(p->Text);
  if (p->Text >= p->UnitsStart)
  {
    RestartModel(p);
    return;
  }
  
  if (fSuccessor)
  {
    if (fSuccessor <= successor)
    {
      CTX_PTR cs = CreateSuccessors(p, False);
      if (cs == NULL)
      {
        RestartModel(p);
        return;
      }
      fSuccessor = REF(cs);
    }
    if (--p->OrderFall == 0)
    {
      successor = fSuccessor;
      p->Text -= (p->MaxContext != p->MinContext);
    }
  }
  else
  {
    SetSuccessor(p->FoundState, successor);
    fSuccessor = REF(p->MinContext);
  }
  
  s0 = p->MinContext->SummFreq - (ns = p->MinContext->NumStats) - (p->FoundState->Freq - 1);
  
  for (c = p->MaxContext; c != p->MinContext; c = SUFFIX(c))
  {
    unsigned ns1;
    UInt32 cf, sf;
    if ((ns1 = c->NumStats) != 1)
    {
      if ((ns1 & 1) == 0)
      {
        /* Expand for one UNIT */
        unsigned oldNU = ns1 >> 1;
        unsigned i = U2I(oldNU);
        if (i != U2I(oldNU + 1))
        {
          void *ptr = AllocUnits(p, i + 1);
          void *oldPtr;
          if (!ptr)
          {
            RestartModel(p);
            return;
          }
          oldPtr = STATS(c);
          MyMem12Cpy(ptr, oldPtr, oldNU);
          InsertNode(p, oldPtr, i);
          c->Stats = STATS_REF(ptr);
        }
      }
      c->SummFreq = (UInt16)(c->SummFreq + (2 * ns1 < ns) + 2 * ((4 * ns1 <= ns) & (c->SummFreq <= 8 * ns1)));
    }
    else
    {
      CPpmd_State *s = (CPpmd_State*)AllocUnits(p, 0);
      if (!s)
      {
        RestartModel(p);
        return;
      }
      *s = *ONE_STATE(c);
      c->Stats = REF(s);
      if (s->Freq < MAX_FREQ / 4 - 1)
        s->Freq <<= 1;
      else
        s->Freq = MAX_FREQ - 4;
      c->SummFreq = (UInt16)(s->Freq + p->InitEsc + (ns > 3));
    }
    cf = 2 * (UInt32)p->FoundState->Freq * (c->SummFreq + 6);
    sf = (UInt32)s0 + c->SummFreq;
    if (cf < 6 * sf)
    {
      cf = 1 + (cf > sf) + (cf >= 4 * sf);
      c->SummFreq += 3;
    }
    else
    {
      cf = 4 + (cf >= 9 * sf) + (cf >= 12 * sf) + (cf >= 15 * sf);
      c->SummFreq = (UInt16)(c->SummFreq + cf);
    }
    {
      CPpmd_State *s = STATS(c) + ns1;
      SetSuccessor(s, successor);
      s->Symbol = p->FoundState->Symbol;
      s->Freq = (Byte)cf;
      c->NumStats = (UInt16)(ns1 + 1);
    }
  }
  p->MaxContext = p->MinContext = CTX(fSuccessor);
}